

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Mat(Mat *this,double x,double y,double z,double X,double Y,double Z)

{
  double *pdVar1;
  double Z_local;
  double Y_local;
  double X_local;
  double z_local;
  double y_local;
  double x_local;
  Mat *this_local;
  
  pdVar1 = (double *)operator_new__(0x30);
  this->v_ = pdVar1;
  this->n_rows_ = 6;
  this->n_cols_ = 1;
  *this->v_ = x;
  this->v_[1] = y;
  this->v_[2] = z;
  this->v_[3] = X;
  this->v_[4] = Y;
  this->v_[5] = Z;
  return;
}

Assistant:

Mat::Mat (double x, double y, double z,   // 6dim-vector
          double X, double Y, double Z)  
{
	v_= new double [6];
	n_rows_ = 6;
	n_cols_ = 1;
	v_[0] = x;
	v_[1] = y;
	v_[2] = z;
	v_[3] = X;
	v_[4] = Y;
	v_[5] = Z;  
}